

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::RegisterTests
          (ParameterizedTestSuiteInfo<UnsignedLongLong> *this)

{
  ParamNameGeneratorFunc *pPVar1;
  char *filename;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference psVar5;
  pointer pIVar6;
  ulong uVar7;
  element_type *peVar8;
  unsigned_long_long *puVar9;
  ostream *poVar10;
  void *pvVar11;
  size_type sVar12;
  Message *this_00;
  char *test_suite_name_00;
  char *name;
  char *value_param;
  undefined4 extraout_var;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  pointer pTVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar14;
  CodeLocation local_1f0;
  CodeLocation local_1c8;
  string local_1a0;
  string local_180;
  _Base_ptr local_160;
  undefined1 local_158;
  GTestLog local_150;
  GTestLog local_14c;
  TestParamInfo<unsigned_long_long> local_148;
  undefined1 local_138 [8];
  string param_name;
  Message test_name_stream;
  undefined1 local_108 [8];
  iterator param_it;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  size_t i;
  string local_a8 [8];
  string test_suite_name;
  int line;
  char *file;
  ParamNameGeneratorFunc *name_func;
  undefined1 local_60 [8];
  ParamGenerator<unsigned_long_long> generator;
  string *instantiation_name;
  __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>_>
  local_40;
  iterator gen_it;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo> test_info;
  __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_>_>_>
  local_20;
  iterator test_it;
  bool generated_instantiations;
  ParameterizedTestSuiteInfo<UnsignedLongLong> *this_local;
  
  test_it._M_current._7_1_ = 0;
  local_20._M_current =
       (shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo> *)
       std::
       vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_>_>
       ::begin(&this->tests_);
  while( true ) {
    test_info.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_>_>
         ::end(&this->tests_);
    bVar2 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_>_>_>
                        *)&test_info.
                           super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount);
    if (!bVar2) break;
    psVar5 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_>_>_>
             ::operator*(&local_20);
    std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>::
    shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>
                *)&gen_it,psVar5);
    local_40._M_current =
         (InstantiationInfo *)
         std::
         vector<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>
         ::begin(&this->instantiations_);
    while( true ) {
      instantiation_name =
           (string *)
           std::
           vector<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>
           ::end(&this->instantiations_);
      bVar2 = __gnu_cxx::operator!=
                        (&local_40,
                         (__normal_iterator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>_>
                          *)&instantiation_name);
      if (!bVar2) break;
      generator.impl_.
      super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_long_long>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __gnu_cxx::
           __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>_>
           ::operator->(&local_40);
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>_>
               ::operator->(&local_40);
      (*pIVar6->generator)(local_60);
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>_>
               ::operator->(&local_40);
      pPVar1 = pIVar6->name_func;
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>_>
               ::operator->(&local_40);
      filename = pIVar6->file;
      pIVar6 = __gnu_cxx::
               __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>_>
               ::operator->(&local_40);
      test_suite_name.field_2._12_4_ = pIVar6->line;
      std::__cxx11::string::string(local_a8);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       generator.impl_.
                       super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_long_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi,"/");
        std::__cxx11::string::operator=(local_a8,(string *)&i);
        std::__cxx11::string::~string((string *)&i);
      }
      peVar8 = std::
               __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&gen_it);
      std::__cxx11::string::operator+=(local_a8,(string *)peVar8);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&param_it);
      ParamGenerator<unsigned_long_long>::begin((ParamGenerator<unsigned_long_long> *)local_108);
      while( true ) {
        ParamGenerator<unsigned_long_long>::end
                  ((ParamGenerator<unsigned_long_long> *)&test_name_stream);
        bVar2 = ParamIterator<unsigned_long_long>::operator!=
                          ((ParamIterator<unsigned_long_long> *)local_108,
                           (ParamIterator<unsigned_long_long> *)&test_name_stream);
        ParamIterator<unsigned_long_long>::~ParamIterator
                  ((ParamIterator<unsigned_long_long> *)&test_name_stream);
        if (!bVar2) break;
        test_it._M_current._7_1_ = 1;
        Message::Message((Message *)((long)&param_name.field_2 + 8));
        puVar9 = ParamIterator<unsigned_long_long>::operator*
                           ((ParamIterator<unsigned_long_long> *)local_108);
        TestParamInfo<unsigned_long_long>::TestParamInfo
                  (&local_148,puVar9,
                   test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
        (*pPVar1)((string *)local_138,&local_148);
        bVar2 = IsValidParamName((string *)local_138);
        bVar2 = IsTrue(bVar2);
        if (!bVar2) {
          GTestLog::GTestLog(&local_14c,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x23f);
          poVar10 = GTestLog::GetStream(&local_14c);
          poVar10 = std::operator<<(poVar10,"Condition IsValidParamName(param_name) failed. ");
          poVar10 = std::operator<<(poVar10,"Parameterized test name \'");
          poVar10 = std::operator<<(poVar10,(string *)local_138);
          poVar10 = std::operator<<(poVar10,"\' is invalid, in ");
          poVar10 = std::operator<<(poVar10,filename);
          poVar10 = std::operator<<(poVar10," line ");
          pvVar11 = (void *)std::ostream::operator<<(poVar10,test_suite_name.field_2._12_4_);
          std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog(&local_14c);
        }
        sVar12 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&param_it,(key_type *)local_138);
        bVar2 = IsTrue(sVar12 == 0);
        if (!bVar2) {
          GTestLog::GTestLog(&local_150,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x244);
          poVar10 = GTestLog::GetStream(&local_150);
          poVar10 = std::operator<<(poVar10,
                                    "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar10 = std::operator<<(poVar10,"Duplicate parameterized test name \'");
          poVar10 = std::operator<<(poVar10,(string *)local_138);
          poVar10 = std::operator<<(poVar10,"\', in ");
          poVar10 = std::operator<<(poVar10,filename);
          poVar10 = std::operator<<(poVar10," line ");
          pvVar11 = (void *)std::ostream::operator<<(poVar10,test_suite_name.field_2._12_4_);
          std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
          GTestLog::~GTestLog(&local_150);
        }
        pVar14 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&param_it,(value_type *)local_138);
        local_160 = (_Base_ptr)pVar14.first._M_node;
        local_158 = pVar14.second;
        std::
        __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&gen_it);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          peVar8 = std::
                   __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&gen_it);
          this_00 = Message::operator<<((Message *)((long)&param_name.field_2 + 8),
                                        &peVar8->test_base_name);
          Message::operator<<(this_00,(char (*) [2])0x2fabd2);
        }
        Message::operator<<((Message *)((long)&param_name.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_138);
        test_suite_name_00 = (char *)std::__cxx11::string::c_str();
        Message::GetString_abi_cxx11_(&local_180,(Message *)((long)&param_name.field_2 + 8));
        name = (char *)std::__cxx11::string::c_str();
        puVar9 = ParamIterator<unsigned_long_long>::operator*
                           ((ParamIterator<unsigned_long_long> *)local_108);
        PrintToString<unsigned_long_long>(&local_1a0,puVar9);
        value_param = (char *)std::__cxx11::string::c_str();
        peVar8 = std::
                 __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&gen_it);
        CodeLocation::CodeLocation(&local_1c8,&peVar8->code_location);
        iVar4 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])();
        set_up_tc = SuiteApiResolver<UnsignedLongLong>::GetSetUpCaseOrSuite
                              (filename,test_suite_name.field_2._12_4_);
        tear_down_tc = SuiteApiResolver<UnsignedLongLong>::GetTearDownCaseOrSuite
                                 (filename,test_suite_name.field_2._12_4_);
        peVar8 = std::
                 __shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&gen_it);
        pTVar13 = std::
                  unique_ptr<testing::internal::TestMetaFactoryBase<unsigned_long_long>,_std::default_delete<testing::internal::TestMetaFactoryBase<unsigned_long_long>_>_>
                  ::operator->(&peVar8->test_meta_factory);
        puVar9 = ParamIterator<unsigned_long_long>::operator*
                           ((ParamIterator<unsigned_long_long> *)local_108);
        iVar3 = (*pTVar13->_vptr_TestMetaFactoryBase[2])(pTVar13,*puVar9);
        MakeAndRegisterTestInfo
                  (test_suite_name_00,name,(char *)0x0,value_param,&local_1c8,
                   (TypeId)CONCAT44(extraout_var,iVar4),set_up_tc,tear_down_tc,
                   (TestFactoryBase *)CONCAT44(extraout_var_00,iVar3));
        CodeLocation::~CodeLocation(&local_1c8);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)local_138);
        Message::~Message((Message *)((long)&param_name.field_2 + 8));
        ParamIterator<unsigned_long_long>::operator++
                  ((ParamIterator<unsigned_long_long> *)local_108);
        test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count =
             test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
      }
      ParamIterator<unsigned_long_long>::~ParamIterator
                ((ParamIterator<unsigned_long_long> *)local_108);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&param_it);
      std::__cxx11::string::~string(local_a8);
      ParamGenerator<unsigned_long_long>::~ParamGenerator
                ((ParamGenerator<unsigned_long_long> *)local_60);
      __gnu_cxx::
      __normal_iterator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo_*,_std::vector<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::InstantiationInfo>_>_>
      ::operator++(&local_40);
    }
    std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>::
    ~shared_ptr((shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>
                 *)&gen_it);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_*,_std::vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_>_>_>
    ::operator++(&local_20);
  }
  if ((test_it._M_current._7_1_ & 1) == 0) {
    iVar4 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                      ();
    CodeLocation::CodeLocation(&local_1f0,&this->code_location_);
    bVar2 = std::
            vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<UnsignedLongLong>::TestInfo>_>_>
            ::empty(&this->tests_);
    InsertSyntheticTestCase((string *)CONCAT44(extraout_var_01,iVar4),&local_1f0,!bVar2);
    CodeLocation::~CodeLocation(&local_1f0);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin(); gen_it != instantiations_.end();
               ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if ( !instantiation_name.empty() )
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name = name_func(
              TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file
              << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name
              << "', in " << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }  // for gen_it
    }  // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }